

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

void deleteBasisEntries(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
                       bool *deleted_basic,bool *deleted_nonbasic,
                       HighsIndexCollection *index_collection,HighsInt entry_dim)

{
  pointer pHVar1;
  bool bVar2;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this;
  long lVar3;
  bool *pbVar4;
  int iVar5;
  int iVar6;
  size_type __new_size;
  HighsInt keep_to_entry;
  HighsInt to_k;
  HighsInt current_set_entry;
  HighsInt keep_from_entry;
  HighsInt delete_to_entry;
  HighsInt delete_from_entry;
  HighsInt from_k;
  HighsInt local_5c;
  int local_58;
  HighsInt local_54;
  int local_50;
  int local_4c;
  uint local_48;
  int local_44;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *local_40;
  HighsIndexCollection *local_38;
  
  local_40 = status;
  local_38 = index_collection;
  limits(index_collection,&local_44,&local_58);
  this = local_40;
  if (local_44 <= local_58) {
    local_5c = -1;
    local_54 = 0;
    __new_size = 0;
    *deleted_basic = false;
    *deleted_nonbasic = false;
    if (local_44 <= local_58) {
      iVar5 = local_44;
      while( true ) {
        updateOutInIndex(local_38,(HighsInt *)&local_48,&local_4c,&local_50,&local_5c,&local_54);
        if (iVar5 == local_44) {
          __new_size = (size_type)local_48;
        }
        iVar6 = (int)__new_size;
        if ((int)local_48 <= local_4c) {
          pHVar1 = (this->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar3 = 0;
          do {
            pbVar4 = deleted_nonbasic;
            if (pHVar1[lVar3 + (int)local_48] == kBasic) {
              pbVar4 = deleted_basic;
            }
            *pbVar4 = true;
            lVar3 = lVar3 + 1;
          } while ((local_4c - local_48) + 1 != (int)lVar3);
        }
        if (entry_dim + -1 <= local_4c) break;
        if (local_50 <= local_5c) {
          pHVar1 = (this->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar3 = 0;
          do {
            pHVar1[lVar3 + iVar6] = pHVar1[lVar3 + local_50];
            lVar3 = lVar3 + 1;
          } while ((local_5c - local_50) + 1 != (int)lVar3);
          __new_size = (size_type)(uint)(iVar6 + (int)lVar3);
        }
        iVar6 = (int)__new_size;
        if ((entry_dim + -1 <= local_5c) || (bVar2 = local_58 <= iVar5, iVar5 = iVar5 + 1, bVar2))
        break;
      }
      __new_size = (size_type)iVar6;
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(this,__new_size);
  }
  return;
}

Assistant:

void deleteBasisEntries(std::vector<HighsBasisStatus>& status,
                        bool& deleted_basic, bool& deleted_nonbasic,
                        const HighsIndexCollection& index_collection,
                        const HighsInt entry_dim) {
  assert(ok(index_collection));
  assert(static_cast<size_t>(entry_dim) == status.size());
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_entry;
  HighsInt delete_to_entry;
  HighsInt keep_from_entry;
  HighsInt keep_to_entry = -1;
  HighsInt current_set_entry = 0;
  HighsInt new_num_entry = 0;
  deleted_basic = false;
  deleted_nonbasic = false;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_entry, delete_to_entry,
                     keep_from_entry, keep_to_entry, current_set_entry);
    // Account for the initial entries being kept
    if (k == from_k) new_num_entry = delete_from_entry;
    // Identify whether a basic or a nonbasic entry has been deleted
    for (HighsInt entry = delete_from_entry; entry <= delete_to_entry;
         entry++) {
      if (status[entry] == HighsBasisStatus::kBasic) {
        deleted_basic = true;
      } else {
        deleted_nonbasic = true;
      }
    }
    if (delete_to_entry >= entry_dim - 1) break;
    for (HighsInt entry = keep_from_entry; entry <= keep_to_entry; entry++) {
      status[new_num_entry] = status[entry];
      new_num_entry++;
    }
    if (keep_to_entry >= entry_dim - 1) break;
  }
  status.resize(new_num_entry);
}